

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputForcedType_abi_cxx11_(Node *this,VARTYPE VarType)

{
  int in_EDX;
  undefined4 in_register_00000034;
  Node *this_00;
  undefined1 local_160 [32];
  undefined1 local_140 [71];
  allocator local_f9;
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [48];
  undefined1 local_48 [44];
  int NeedForce;
  int ThisType;
  VARTYPE VarType_local;
  Node *this_local;
  string *result;
  
  this_00 = (Node *)CONCAT44(in_register_00000034,VarType);
  NeedForce = in_EDX;
  _ThisType = this_00;
  this_local = this;
  local_48._40_4_ = GetNodeVarType(this_00);
  local_48._36_4_ = 0;
  local_48[0x23] = 0;
  std::__cxx11::string::string((string *)this);
  if (this_00->Type == 0x203) {
    NoParen_abi_cxx11_((Node *)local_48);
    std::__cxx11::string::operator=((string *)this,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    if (NeedForce == 9) {
      if ((((local_48._40_4_ != VARTYPE_BYTE) && (local_48._40_4_ != VARTYPE_WORD)) &&
          (local_48._40_4_ != VARTYPE_INTEGER)) && (local_48._40_4_ != VARTYPE_LONG)) {
        local_48._36_4_ = 1;
      }
    }
    else if (local_48._40_4_ != NeedForce) {
      local_48._36_4_ = 1;
    }
    if (local_48._36_4_ == 0) {
      NoParen_abi_cxx11_((Node *)local_160);
      std::__cxx11::string::operator=((string *)this,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"(",&local_f9);
      OutputVarType_abi_cxx11_((int)local_140 + 0x20);
      std::operator+(local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f8);
      std::operator+(local_b8,(char *)local_d8);
      NoParen_abi_cxx11_((Node *)local_140);
      std::operator+(local_98,local_b8);
      std::operator+(local_78,(char *)local_98);
      std::__cxx11::string::operator=((string *)this,(string *)local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)(local_140 + 0x20));
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    }
  }
  return this;
}

Assistant:

std::string Node::OutputForcedType(
	VARTYPE VarType		/**< Variable type */
)
{
	int ThisType = GetNodeVarType();	// Var type of this node
	int NeedForce = 0;			// Do we need to force the type
	std::string result;

	//
	// A NULL will match anything
	//
	if (Type == BAS_N_NULL)
	{
		result = NoParen();
		return result;
//		return 0;
	}

	//
	// Determine if we really need to force
	//
	switch(VarType)
	{
	case VARTYPE_INTEGER:
		//
		// Integer type allows for BYTE, INTEGER, LONG
		//
		if ((ThisType != VARTYPE_BYTE) &&
			(ThisType != VARTYPE_WORD) &&
			(ThisType != VARTYPE_INTEGER) &&
			(ThisType != VARTYPE_LONG))
		{
			NeedForce = 1;
		}
		break;

	default:
		if (ThisType != VarType)
		{
			NeedForce = 1;
		}
	}

	//
	// Now force out the proper code
	//
	if (NeedForce)
	{
		result = std::string("(") + OutputVarType(VarType) + ")(" +
			NoParen() + ")";
	}
	else
	{
		result = NoParen();
	}

	return result;
}